

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_dileave3_reverses_ileave3_::run
          (Test_bitileave_dileave3_reverses_ileave3_ *this)

{
  SourceLocation loc;
  result_type_conflict rVar1;
  result_type_conflict rVar2;
  ull_type uVar3;
  long lVar4;
  bool bVar5;
  string_view msg;
  uint32_t expected [3];
  uint32_t actual [3];
  uniform_int_distribution<unsigned_int> distr;
  mt19937 rng;
  result_type_conflict local_14b0;
  result_type_conflict local_14ac;
  result_type_conflict local_14a8;
  uint local_14a4;
  undefined1 local_14a0 [4];
  undefined1 local_149c [4];
  char *local_1498;
  char *pcStack_1490;
  undefined8 local_1488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  param_type local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1418;
  enable_if_t<isStringifieable<unsigned_int[3]>,_std::string> local_13f8;
  enable_if_t<isStringifieable<unsigned_int[3]>,_std::string> local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,0x3039);
  local_1460._M_a = 0;
  local_1460._M_b = 0x200000;
  lVar4 = 0x400;
  do {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) {
      return;
    }
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_1460,&local_13b8);
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_1460,&local_13b8);
    local_14a8 = std::uniform_int_distribution<unsigned_int>::operator()
                           ((uniform_int_distribution<unsigned_int> *)&local_1460,&local_13b8);
    local_14b0 = rVar1;
    local_14ac = rVar2;
    uVar3 = detail::ileave_impl<unsigned_int,unsigned_int,unsigned_int,0ul,1ul,2ul>
                      (rVar1,rVar2,local_14a8);
    detail::dileave_naive_impl<unsigned_int,unsigned_int,unsigned_int,0ul,1ul,2ul>
              (uVar3,(uint (*) [3])&local_14a4,local_14a0,local_149c);
    bVar5 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int,3ul>
                      ((uint (*) [3])&local_14a4,(uint (*) [3])&local_14b0);
  } while (bVar5);
  stringify<unsigned_int[3]>(&local_13d8,(uint (*) [3])&local_14a4);
  std::operator+(&local_1458,"Comparison failed: actual == expected (with \"actual\"=",&local_13d8);
  std::operator+(&local_1438,&local_1458,", \"expected\"=");
  stringify<unsigned_int[3]>(&local_13f8,(uint (*) [3])&local_14b0);
  std::operator+(&local_1418,&local_1438,&local_13f8);
  std::operator+(&local_1480,&local_1418,")");
  local_1498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_1490 = "run";
  local_1488 = 0x111;
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0x111;
  msg._M_str = local_1480._M_dataplus._M_p;
  msg._M_len = local_1480._M_string_length;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(bitileave, dileave3_reverses_ileave3)
{
    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, 1u << 21};

    for (size_t i = 0; i < 1024 * 1; ++i) {
        const auto x = distr(rng), y = distr(rng), z = distr(rng);
        std::uint32_t expected[] = {x, y, z};
        std::uint32_t actual[3];
        detail::dileave_naive(ileave(x, y, z), actual[0], actual[1], actual[2]);
        BITMANIP_ASSERT_EQ(actual, expected);
    }
}